

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_addInterval(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  vm_obj_id_t obj;
  vm_date_ext *pvVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  double dVar4;
  caldate_t *this_00;
  double day_carry;
  vm_val_t ele;
  int i;
  int cnt;
  double daytime;
  caldate_t cd;
  int32_t dayno;
  vm_val_t *lst;
  uint argc;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  vm_val_t *in_stack_ffffffffffffff60;
  vm_val_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int n;
  int idx;
  vm_val_t *in_stack_ffffffffffffff80;
  int local_78;
  int local_68;
  double local_60;
  int local_50;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  idx = n;
  if ((getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_addInterval::desc,1);
    __cxa_guard_release(&getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff68,&in_stack_ffffffffffffff60->typ,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (iVar1 == 0) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_listlike((vm_val_t *)CONCAT44(idx,in_stack_ffffffffffffff70));
    if (iVar1 == 0) {
      err_throw(0);
    }
    get_ext((CVmObjDate *)in_RDI);
    caldate_t::caldate_t((caldate_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pvVar3 = get_ext((CVmObjDate *)in_RDI);
    local_60 = (double)pvVar3->daytime;
    iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffff68);
    for (local_68 = 1; local_68 <= iVar1; local_68 = local_68 + 1) {
      vm_val_t::ll_index(in_stack_ffffffffffffff80,in_RDI,idx);
      if (local_78 != 1) {
        switch(local_68) {
        case 1:
          vm_val_t::num_to_int(in_stack_ffffffffffffff60);
          break;
        case 2:
          vm_val_t::num_to_int(in_stack_ffffffffffffff60);
          break;
        case 3:
          iVar2 = vm_val_t::num_to_int(in_stack_ffffffffffffff60);
          local_50 = iVar2 + local_50;
          break;
        case 4:
          dVar4 = vm_val_t::num_to_double(in_stack_ffffffffffffff60);
          local_60 = dVar4 * 60.0 * 60.0 * 1000.0 + local_60;
          break;
        case 5:
          dVar4 = vm_val_t::num_to_double(in_stack_ffffffffffffff60);
          local_60 = dVar4 * 60.0 * 1000.0 + local_60;
          break;
        case 6:
          dVar4 = vm_val_t::num_to_double(in_stack_ffffffffffffff60);
          local_60 = dVar4 * 1000.0 + local_60;
        }
      }
    }
    this_00 = (caldate_t *)floor(local_60 / 86400000.0);
    if ((2147483647.0 < (double)this_00 + (double)local_50) ||
       ((double)this_00 + (double)local_50 < -2147483648.0)) {
      err_throw(0);
    }
    caldate_t::dayno(this_00);
    obj = create((int)((ulong)in_RDX >> 0x20),(int32_t)in_RDX,in_stack_ffffffffffffff5c);
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_addInterval(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the interval list */
    vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* retrieve my date as a calendar object */
    int32_t dayno = get_ext()->dayno;
    caldate_t cd(dayno);

    /* retrieve my time as a double, to allow for overflows from int32 */
    double daytime = get_ext()->daytime;

    /* add each element from the list */
    int cnt = lst->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this interval element */
        vm_val_t ele;
        lst->ll_index(vmg_ &ele, i);

        /* treat nil as zero */
        if (ele.typ == VM_NIL)
            continue;

        /* add it to the appropriate date or time component */
        switch (i)
        {
        case 1: cd.y += ele.num_to_int(vmg0_); break;
        case 2: cd.m += ele.num_to_int(vmg0_); break;
        case 3: cd.d += ele.num_to_int(vmg0_); break;

        case 4: daytime += ele.num_to_double(vmg0_)*60.*60.*1000.; break;
        case 5: daytime += ele.num_to_double(vmg0_)*60.*1000.; break;
        case 6: daytime += ele.num_to_double(vmg0_)*1000.; break;
        }
    }

    /* carry overflows from the time into the day */
    double day_carry = floor(daytime / (24.*60.*60.*1000.));
    daytime -= day_carry * (24.*60.*60.*1000.);

    if (day_carry + cd.d > INT32MAXVAL || day_carry + cd.d < INT32MINVAL)
        err_throw(VMERR_NUM_OVERFLOW);

    cd.d += (int32_t)day_carry;

    /* return the new date, using our same local timezone */
    retval->set_obj(create(vmg_ FALSE, cd.dayno(), (int32_t)daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}